

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O0

bool midi_processor::process_xmi_count
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,size_t *track_count)

{
  bool bVar1;
  uint uVar2;
  iff_chunk *piVar3;
  ulong uVar4;
  uint _track_count;
  iff_chunk *cat_chunk;
  iff_chunk *form_chunk;
  undefined1 local_70 [8];
  iff_stream xmi_file;
  size_t *track_count_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file_local;
  
  *track_count = 0;
  xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)track_count;
  iff_stream::iff_stream((iff_stream *)local_70);
  bVar1 = read_iff_stream(p_file,(iff_stream *)local_70);
  if (bVar1) {
    piVar3 = iff_stream::find_chunk((iff_stream *)local_70,"FORM");
    if (*(int *)piVar3->m_type == 0x52494458) {
      piVar3 = iff_stream::find_chunk((iff_stream *)local_70,"CAT ");
      if (*(int *)piVar3->m_type == 0x44494d58) {
        uVar2 = iff_chunk::get_chunk_count(piVar3,"FORM");
        uVar4 = (ulong)uVar2;
        (xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->m_id[0] = (char)uVar4;
        (xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->m_id[1] = (char)(uVar4 >> 8);
        (xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->m_id[2] = (char)(uVar4 >> 0x10);
        (xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->m_id[3] = (char)(uVar4 >> 0x18);
        (xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type[0] = (char)(uVar4 >> 0x20);
        (xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type[1] = (char)(uVar4 >> 0x28);
        (xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type[2] = (char)(uVar4 >> 0x30);
        (xmi_file.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type[3] = (char)(uVar4 >> 0x38);
        p_file_local._7_1_ = true;
      }
      else {
        p_file_local._7_1_ = false;
      }
    }
    else {
      p_file_local._7_1_ = false;
    }
  }
  else {
    p_file_local._7_1_ = false;
  }
  iff_stream::~iff_stream((iff_stream *)local_70);
  return p_file_local._7_1_;
}

Assistant:

bool midi_processor::process_xmi_count( std::vector<uint8_t> const& p_file, size_t & track_count )
{
    track_count = 0;

    iff_stream xmi_file;
    if ( !read_iff_stream( p_file, xmi_file ) ) return false;

    const iff_chunk & form_chunk = xmi_file.find_chunk( "FORM" );
    if ( memcmp( form_chunk.m_type, "XDIR", 4 ) ) return false; /*throw exception_io_data( "XMI IFF not XDIR type" );*/

    const iff_chunk & cat_chunk = xmi_file.find_chunk( "CAT " );
    if ( memcmp( cat_chunk.m_type, "XMID", 4 ) ) return false; /*throw exception_io_data( "XMI CAT chunk not XMID type" );*/

    unsigned _track_count = cat_chunk.get_chunk_count( "FORM" );

    track_count = _track_count;

    return true;
}